

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void exchange_fields(int nm1,int nm2)

{
  pointer psVar1;
  int in_EDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int mod;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int left;
  
  for (left = 0; left < 2; left = left + 1) {
    if (mpi_rank % 2 == left) {
      if (0 < mpi_rank) {
        send_field_slice(left,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
      }
      if (mpi_rank < n_sr + -1) {
        psVar1 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                           ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                            0x146f91);
        spatial_region::get_nx(psVar1);
        send_field_slice(left,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
      }
    }
    else {
      if (mpi_rank < n_sr + -1) {
        psVar1 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                           ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                            0x146fd6);
        spatial_region::get_nx(psVar1);
        receive_field_slice(unaff_retaddr_00,unaff_retaddr,in_EDI);
      }
      if (0 < mpi_rank) {
        receive_field_slice(unaff_retaddr_00,unaff_retaddr,in_EDI);
      }
    }
  }
  return;
}

Assistant:

void exchange_fields(int nm1, int nm2) {
    for (int mod=0; mod<2; mod++) {

        // first even processes send, while odd receive, then vice versa
        if (mpi_rank % 2 == mod) {
            if (mpi_rank > 0) {
                send_field_slice(nm1, nm2, mpi_rank-1);
            }

            if (mpi_rank < n_sr-1) {
                send_field_slice(psr->get_nx() - nm2 - nm1, nm1, mpi_rank+1);
            }
        } else {
            if (mpi_rank < n_sr-1) {
                receive_field_slice(psr->get_nx() - nm2, nm2, mpi_rank+1);
            }

            if (mpi_rank > 0) {
                receive_field_slice(0, nm1, mpi_rank-1);
            }
        }
    }
}